

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O3

void print<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *t,char *s)

{
  long lVar1;
  undefined8 in_RAX;
  size_t sVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  undefined8 uStack_38;
  
  lVar1 = std::cout;
  *(undefined8 *)(tolower + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x10f0c0);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  p_Var4 = (t->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)t) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(char *)p_Var4[1]._M_next,(long)p_Var4[1]._M_prev);
      p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)t);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T const & t, char const * s) {
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}